

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
* __thiscall AddrManImpl::GetEntries_(AddrManImpl *this,bool from_tried)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  byte in_DL;
  AddrManImpl *in_RSI;
  vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  int position;
  int bucket;
  int bucket_count;
  vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  *infos;
  AddressPosition location;
  nid_type id;
  AddrInfo info;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  mapped_type *in_stack_ffffffffffffff00;
  AddrInfo *in_stack_ffffffffffffff08;
  int local_c4;
  int local_c0;
  undefined4 local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec,(AnnotatedMixin<std::mutex> *)0x88150d);
  iVar3 = 0x400;
  if ((in_DL & 1) != 0) {
    iVar3 = 0x100;
  }
  std::
  vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  ::vector((vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
            *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  for (local_c0 = 0; local_c0 < iVar3; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < 0x40; local_c4 = local_c4 + 1) {
      in_stack_ffffffffffffff08 =
           (AddrInfo *)
           GetEntry(in_RSI,SUB81((ulong)in_RDI >> 0x38,0),(size_t)in_stack_ffffffffffffff08,
                    (size_t)in_stack_ffffffffffffff00);
      if (-1 < (long)in_stack_ffffffffffffff08) {
        in_stack_ffffffffffffff00 =
             std::
             unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
             ::at((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                   *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                  (key_type *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        AddrInfo::AddrInfo(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        uVar2 = CONCAT13(in_DL,(int3)in_stack_fffffffffffffefc);
        in_stack_fffffffffffffefc = uVar2 & 0x1ffffff;
        in_stack_fffffffffffffef8 = local_14;
        if ((in_DL & 1) != 0) {
          in_stack_fffffffffffffef8 = 1;
        }
        AddressPosition::AddressPosition
                  ((AddressPosition *)
                   (CONCAT44(uVar2,in_stack_fffffffffffffef8) & 0x1ffffffffffffff),
                   SUB41((uint)in_stack_fffffffffffffef4 >> 0x18,0),in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
        std::
        vector<std::pair<AddrInfo,AddressPosition>,std::allocator<std::pair<AddrInfo,AddressPosition>>>
        ::emplace_back<AddrInfo&,AddressPosition&>
                  ((vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
                    *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   (AddressPosition *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
        ;
        AddrInfo::~AddrInfo((AddrInfo *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::pair<AddrInfo, AddressPosition>> AddrManImpl::GetEntries_(bool from_tried) const
{
    AssertLockHeld(cs);

    const int bucket_count = from_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT;
    std::vector<std::pair<AddrInfo, AddressPosition>> infos;
    for (int bucket = 0; bucket < bucket_count; ++bucket) {
        for (int position = 0; position < ADDRMAN_BUCKET_SIZE; ++position) {
            nid_type id = GetEntry(from_tried, bucket, position);
            if (id >= 0) {
                AddrInfo info = mapInfo.at(id);
                AddressPosition location = AddressPosition(
                    from_tried,
                    /*multiplicity_in=*/from_tried ? 1 : info.nRefCount,
                    bucket,
                    position);
                infos.emplace_back(info, location);
            }
        }
    }

    return infos;
}